

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void cmGlobalNinjaGenerator::GetDocumentation(cmDocumentationEntry *entry)

{
  undefined4 *local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined2 uStack_24;
  undefined2 uStack_22;
  
  local_28 = 0x6a6e694e;
  uStack_24 = 0x61;
  local_30 = 5;
  local_38 = &local_28;
  std::__cxx11::string::operator=((string *)entry,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT26(uStack_22,CONCAT24(uStack_24,local_28)) + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&entry->Brief,0,(char *)(entry->Brief)._M_string_length,0x5b6d3b);
  return;
}

Assistant:

void cmGlobalNinjaGenerator
::GetDocumentation(cmDocumentationEntry& entry)
{
  entry.Name = cmGlobalNinjaGenerator::GetActualName();
  entry.Brief = "Generates build.ninja files.";
}